

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O2

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> * __thiscall
draco::Decoder::DecodeMeshFromBuffer
          (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>
           *__return_storage_ptr__,Decoder *this,DecoderBuffer *in_buffer)

{
  Mesh *this_00;
  Status _local_status;
  undefined1 local_48 [40];
  
  this_00 = (Mesh *)operator_new(0xd8);
  Mesh::Mesh(this_00);
  DecodeBufferToGeometry((Status *)local_48,this,in_buffer,this_00);
  if (local_48._0_4_ == OK) {
    std::__cxx11::string::~string((string *)(local_48 + 8));
    (__return_storage_ptr__->status_).code_ = OK;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
    (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->value_)._M_t.
    super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
    super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
    super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = this_00;
  }
  else {
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
              (__return_storage_ptr__,(Status *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 8));
    (**(code **)((long)(this_00->super_PointCloud)._vptr_PointCloud + 8))(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> Decoder::DecodeMeshFromBuffer(
    DecoderBuffer *in_buffer) {
  std::unique_ptr<Mesh> mesh(new Mesh());
  DRACO_RETURN_IF_ERROR(DecodeBufferToGeometry(in_buffer, mesh.get()))
  return std::move(mesh);
}